

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O2

bool tinyusdz::orthonormalize_basis(double3 *tx,double3 *ty,double3 *tz,bool normalize,double eps)

{
  bool bVar1;
  undefined3 in_register_00000009;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double3 local_158;
  double3 local_140;
  double3 local_128;
  double3 local_108;
  double3 local_e8;
  undefined1 local_c8 [16];
  double local_b8;
  double3 local_a8;
  double local_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  if (CONCAT31(in_register_00000009,normalize) == 0) {
    vnormalize(&local_158,tx,2.220446049250313e-16);
    vnormalize(&local_108,ty,2.220446049250313e-16);
    vnormalize(&local_e8,tz,2.220446049250313e-16);
  }
  else {
    vnormalize(&local_158,tx,2.220446049250313e-16);
    tx->_M_elems[2] = local_158._M_elems[2];
    tx->_M_elems[0] = local_158._M_elems[0];
    tx->_M_elems[1] = local_158._M_elems[1];
    vnormalize(&local_158,ty,2.220446049250313e-16);
    ty->_M_elems[2] = local_158._M_elems[2];
    ty->_M_elems[0] = local_158._M_elems[0];
    ty->_M_elems[1] = local_158._M_elems[1];
    vnormalize(&local_158,tz,2.220446049250313e-16);
    tz->_M_elems[2] = local_158._M_elems[2];
    tz->_M_elems[0] = local_158._M_elems[0];
    tz->_M_elems[1] = local_158._M_elems[1];
    local_158._M_elems[2] = tx->_M_elems[2];
    local_158._M_elems[0] = tx->_M_elems[0];
    local_158._M_elems[1] = tx->_M_elems[1];
    local_108._M_elems[0] = ty->_M_elems[0];
    local_108._M_elems[1] = ty->_M_elems[1];
    local_108._M_elems[2] = ty->_M_elems[2];
    local_e8._M_elems[0] = tz->_M_elems[0];
    local_e8._M_elems[1] = tz->_M_elems[1];
    local_e8._M_elems[2] = tz->_M_elems[2];
  }
  bVar1 = math::is_close(&local_158,&local_108,eps);
  if (((bVar1) || (bVar1 = math::is_close(&local_158,&local_e8,eps), bVar1)) ||
     (bVar1 = math::is_close(&local_108,&local_e8,eps), bVar1)) {
    bVar1 = false;
  }
  else {
    iVar2 = 0x14;
    while( true ) {
      bVar1 = iVar2 != 0;
      iVar2 = iVar2 + -1;
      if (!bVar1) break;
      local_90 = tx->_M_elems[0];
      dVar19 = tx->_M_elems[1];
      dVar14 = tx->_M_elems[2];
      dVar3 = ty->_M_elems[0];
      dVar20 = ty->_M_elems[1];
      dVar15 = ty->_M_elems[2];
      dVar4 = tz->_M_elems[0];
      dVar6 = tz->_M_elems[1];
      dVar5 = tz->_M_elems[2];
      dVar18 = dVar14 * local_108._M_elems[2] +
               local_108._M_elems[0] * local_90 + local_108._M_elems[1] * dVar19;
      dVar11 = dVar5 * local_158._M_elems[2] +
               dVar4 * local_158._M_elems[0] + dVar6 * local_158._M_elems[1];
      dVar13 = dVar15 * local_158._M_elems[2] +
               dVar3 * local_158._M_elems[0] + dVar20 * local_158._M_elems[1];
      uStack_70 = 0;
      uStack_80 = 0;
      dVar16 = dVar5 - local_158._M_elems[2] * dVar11;
      dVar17 = dVar3 - dVar13 * local_158._M_elems[0];
      dVar7 = dVar20 - local_158._M_elems[1] * dVar13;
      dVar13 = dVar15 - local_158._M_elems[2] * dVar13;
      dVar8 = dVar4 - dVar11 * local_158._M_elems[0];
      dVar9 = dVar6 - local_158._M_elems[1] * dVar11;
      dVar21 = dVar16 * local_108._M_elems[2] +
               dVar8 * local_108._M_elems[0] + dVar9 * local_108._M_elems[1];
      dVar22 = dVar13 * local_e8._M_elems[2] +
               dVar17 * local_e8._M_elems[0] + dVar7 * local_e8._M_elems[1];
      dVar12 = local_90 - local_108._M_elems[0] * dVar18;
      dVar10 = dVar19 - dVar18 * local_108._M_elems[1];
      dVar18 = dVar14 - dVar18 * local_108._M_elems[2];
      dVar11 = dVar18 * local_e8._M_elems[2] +
               local_e8._M_elems[0] * dVar12 + local_e8._M_elems[1] * dVar10;
      dVar7 = ((dVar7 - dVar22 * local_e8._M_elems[1]) + dVar20) * 0.5;
      local_b8 = ((dVar13 - local_e8._M_elems[2] * dVar22) + dVar15) * 0.5;
      local_128._M_elems[2] = ((dVar16 - local_108._M_elems[2] * dVar21) + dVar5) * 0.5;
      dVar13 = ((dVar17 - local_e8._M_elems[0] * dVar22) + dVar3) * 0.5;
      local_c8._8_4_ = SUB84(dVar7,0);
      local_c8._0_8_ = dVar13;
      local_c8._12_4_ = (int)((ulong)dVar7 >> 0x20);
      local_a8._M_elems[0] = ((dVar12 - local_e8._M_elems[0] * dVar11) + local_90) * 0.5;
      local_a8._M_elems[1] = ((dVar10 - dVar11 * local_e8._M_elems[1]) + dVar19) * 0.5;
      local_a8._M_elems[2] = ((dVar18 - local_e8._M_elems[2] * dVar11) + dVar14) * 0.5;
      local_128._M_elems[0] = ((dVar8 - dVar21 * local_108._M_elems[0]) + dVar4) * 0.5;
      local_128._M_elems[1] = ((dVar9 - dVar21 * local_108._M_elems[1]) + dVar6) * 0.5;
      local_88 = dVar3;
      local_78 = dVar5;
      local_68 = dVar4;
      dStack_60 = dVar6;
      local_58 = dVar20;
      dStack_50 = dVar15;
      local_48 = dVar19;
      dStack_40 = dVar14;
      if (normalize) {
        vnormalize(&local_140,&local_a8,2.220446049250313e-16);
        local_a8._M_elems[2] = local_140._M_elems[2];
        local_a8._M_elems[0] = local_140._M_elems[0];
        local_a8._M_elems[1] = local_140._M_elems[1];
        vnormalize(&local_140,(double3 *)local_c8,2.220446049250313e-16);
        local_b8 = local_140._M_elems[2];
        local_c8._8_8_ = local_140._M_elems[1];
        local_c8._0_8_ = local_140._M_elems[0];
        vnormalize(&local_140,&local_128,2.220446049250313e-16);
        dVar19 = tx->_M_elems[1];
        dVar3 = ty->_M_elems[0];
        dVar4 = tz->_M_elems[0];
        dVar6 = tz->_M_elems[1];
        dVar5 = tz->_M_elems[2];
        dVar14 = tx->_M_elems[2];
        dVar15 = ty->_M_elems[2];
        dVar20 = ty->_M_elems[1];
        dVar7 = (double)local_c8._8_8_;
        local_128._M_elems[0] = local_140._M_elems[0];
        local_128._M_elems[1] = local_140._M_elems[1];
        local_128._M_elems[2] = local_140._M_elems[2];
        dVar13 = (double)local_c8._0_8_;
      }
      dVar11 = tx->_M_elems[0] - local_a8._M_elems[0];
      if ((dVar5 - local_128._M_elems[2]) * (dVar5 - local_128._M_elems[2]) +
          (dVar4 - local_128._M_elems[0]) * (dVar4 - local_128._M_elems[0]) +
          (dVar6 - local_128._M_elems[1]) * (dVar6 - local_128._M_elems[1]) +
          (dVar15 - local_b8) * (dVar15 - local_b8) +
          (dVar3 - dVar13) * (dVar3 - dVar13) + (dVar20 - dVar7) * (dVar20 - dVar7) +
          (dVar14 - local_a8._M_elems[2]) * (dVar14 - local_a8._M_elems[2]) +
          dVar11 * dVar11 + (dVar19 - local_a8._M_elems[1]) * (dVar19 - local_a8._M_elems[1]) <
          eps * eps) {
        return bVar1;
      }
      tx->_M_elems[2] = local_a8._M_elems[2];
      tx->_M_elems[0] = local_a8._M_elems[0];
      tx->_M_elems[1] = local_a8._M_elems[1];
      ty->_M_elems[2] = local_b8;
      ty->_M_elems[0] = (double)local_c8._0_8_;
      ty->_M_elems[1] = (double)local_c8._8_8_;
      tz->_M_elems[2] = local_128._M_elems[2];
      tz->_M_elems[0] = local_128._M_elems[0];
      tz->_M_elems[1] = local_128._M_elems[1];
      local_158._M_elems[2] = tx->_M_elems[2];
      local_158._M_elems[0] = tx->_M_elems[0];
      local_158._M_elems[1] = tx->_M_elems[1];
      local_108._M_elems[2] = ty->_M_elems[2];
      local_108._M_elems[0] = ty->_M_elems[0];
      local_108._M_elems[1] = ty->_M_elems[1];
      local_e8._M_elems[0] = local_128._M_elems[0];
      local_e8._M_elems[1] = local_128._M_elems[1];
      local_e8._M_elems[2] = local_128._M_elems[2];
      if (!normalize) {
        vnormalize(&local_140,&local_158,2.220446049250313e-16);
        local_158._M_elems[2] = local_140._M_elems[2];
        local_158._M_elems[0] = local_140._M_elems[0];
        local_158._M_elems[1] = local_140._M_elems[1];
        vnormalize(&local_140,&local_108,2.220446049250313e-16);
        local_158._M_elems[2] = local_140._M_elems[2];
        local_158._M_elems[0] = local_140._M_elems[0];
        local_158._M_elems[1] = local_140._M_elems[1];
        vnormalize(&local_140,&local_e8,2.220446049250313e-16);
        local_158._M_elems[2] = local_140._M_elems[2];
        local_158._M_elems[0] = local_140._M_elems[0];
        local_158._M_elems[1] = local_140._M_elems[1];
      }
    }
  }
  return bVar1;
}

Assistant:

bool orthonormalize_basis(value::double3 &tx, value::double3 &ty,
                          value::double3 &tz, const bool normalize,
                          const double eps) {
  value::double3 ax, bx, cx, ay, by, cy, az, bz, cz;

  if (normalize) {
    tx = vnormalize(tx);
    ty = vnormalize(ty);
    tz = vnormalize(tz);
    ax = tx;
    ay = ty;
    az = tz;
  } else {
    ax = vnormalize(tx);
    ay = vnormalize(ty);
    az = vnormalize(tz);
  }

  /* Check for colinear vectors. This is not only a quick-out: the
   * error computation below will evaluate to zero if there's no change
   * after an iteration, which can happen either because we have a good
   * solution or because the vectors are colinear.   So we have to check
   * the colinear case beforehand, or we'll get fooled in the error
   * computation.
   */
  if (math::is_close(ax, ay, eps) || math::is_close(ax, az, eps) ||
      math::is_close(ay, az, eps)) {
    return false;
  }

  constexpr int kMAX_ITERS = 20;
  int iter;
  for (iter = 0; iter < kMAX_ITERS; ++iter) {
    bx = tx;
    by = ty;
    bz = tz;

    bx = bx - vdot(ay, bx) * ay;
    bx = bx - vdot(az, bx) * az;

    by = by - vdot(ax, by) * ax;
    by = by - vdot(az, by) * az;

    bz = bz - vdot(ax, bz) * ax;
    bz = bz - vdot(ay, bz) * ay;

    cx = 0.5 * (tx + bx);
    cy = 0.5 * (ty + by);
    cz = 0.5 * (tz + bz);

    if (normalize) {
      cx = vnormalize(cx);
      cy = vnormalize(cy);
      cz = vnormalize(cz);
    }

    value::double3 xDiff = tx - cx;
    value::double3 yDiff = ty - cy;
    value::double3 zDiff = tz - cz;

    double error = vdot(xDiff, xDiff) + vdot(yDiff, yDiff) + vdot(zDiff, zDiff);

    // error is squared, so compare to squared tolerance
    if (error < (eps * eps)) {
      break;
    }

    tx = cx;
    ty = cy;
    tz = cz;

    ax = tx;
    ay = ty;
    az = tz;

    if (!normalize) {
      ax = vnormalize(ax);
      ax = vnormalize(ay);
      ax = vnormalize(az);
    }
  }

  return iter < kMAX_ITERS;
}